

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

uint __thiscall
Js::FunctionBody::GetLoopProfileThreshold(FunctionBody *this,uint loopInterpreterLimit)

{
  bool bVar1;
  undefined4 local_2c;
  undefined4 local_24;
  uint loopInterpreterLimit_local;
  FunctionBody *this_local;
  
  bVar1 = DoInterpreterProfile(this);
  if (bVar1) {
    bVar1 = DoInterpreterAutoProfile(this);
    if (bVar1) {
      local_24 = GetMinLoopProfileIterations(loopInterpreterLimit);
      local_24 = loopInterpreterLimit - local_24;
    }
    else {
      local_24 = 0;
    }
    local_2c = local_24;
  }
  else {
    local_2c = 0xffffffff;
  }
  return local_2c;
}

Assistant:

uint FunctionBody::GetLoopProfileThreshold(const uint loopInterpreterLimit) const
    {
        return
            DoInterpreterProfile()
                ? DoInterpreterAutoProfile()
                    ? loopInterpreterLimit - GetMinLoopProfileIterations(loopInterpreterLimit)
                    : 0
                : static_cast<uint>(-1);
    }